

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateQueryUtil.cpp
# Opt level: O3

void deqp::gls::StateQueryUtil::verifyIntegerMax
               (ResultCollector *result,QueriedState *state,int maxValue)

{
  ostream *poVar1;
  float fVar2;
  ostringstream buf;
  string local_1c0;
  float local_19c;
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  switch(state->m_type) {
  case DATATYPE_BOOLEAN:
    if (-1 < maxValue) {
      return;
    }
    if ((state->m_v).vBool != false) {
      return;
    }
    std::__cxx11::ostringstream::ostringstream(local_198);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"Expected GL_TRUE, got GL_FALSE",0x1e);
    std::__cxx11::stringbuf::str();
    tcu::ResultCollector::fail(result,&local_1c0);
    break;
  case DATATYPE_INTEGER:
    if ((state->m_v).vInt <= maxValue) {
      return;
    }
    std::__cxx11::ostringstream::ostringstream(local_198);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"Expected less or equal to ",0x1a);
    poVar1 = (ostream *)std::ostream::operator<<(local_198,maxValue);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", got ",6);
    std::ostream::operator<<(poVar1,(state->m_v).vInt);
    std::__cxx11::stringbuf::str();
    tcu::ResultCollector::fail(result,&local_1c0);
    break;
  case DATATYPE_INTEGER64:
    if ((state->m_v).vInt64 <= (long)maxValue) {
      return;
    }
    std::__cxx11::ostringstream::ostringstream(local_198);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"Expected less or equal to ",0x1a);
    poVar1 = (ostream *)std::ostream::operator<<(local_198,maxValue);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", got ",6);
    std::ostream::_M_insert<long>((long)poVar1);
    std::__cxx11::stringbuf::str();
    tcu::ResultCollector::fail(result,&local_1c0);
    break;
  case DATATYPE_FLOAT:
    local_19c = (state->m_v).vFloat;
    fVar2 = deInt32ToFloatRoundToPosInf(maxValue);
    if ((local_19c <= fVar2) && (!NAN((state->m_v).vFloat))) {
      return;
    }
    std::__cxx11::ostringstream::ostringstream(local_198);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"Expected less or equal to ",0x1a);
    poVar1 = (ostream *)std::ostream::operator<<(local_198,maxValue);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", got ",6);
    std::ostream::_M_insert<double>((double)(state->m_v).vFloat);
    std::__cxx11::stringbuf::str();
    tcu::ResultCollector::fail(result,&local_1c0);
    break;
  default:
    goto switchD_0049658c_default;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_198);
  std::ios_base::~ios_base(local_128);
switchD_0049658c_default:
  return;
}

Assistant:

DataType QueriedState::getType (void) const
{
	return m_type;
}